

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O0

err_t brngHMACRand(void *buf,size_t count,octet *key,size_t key_len,octet *iv,size_t iv_len)

{
  bool_t bVar1;
  blob_t pvVar2;
  size_t in_RCX;
  void *in_RDX;
  octet *in_RSI;
  void *in_RDI;
  void *in_R8;
  size_t in_R9;
  void *unaff_retaddr;
  void *state;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  bVar1 = memIsValid(in_RDX,in_RCX);
  if ((((bVar1 != 0) && (bVar1 = memIsValid(in_R8,in_R9), bVar1 != 0)) &&
      (bVar1 = memIsValid(in_RDI,(size_t)in_RSI), bVar1 != 0)) &&
     (bVar1 = memIsDisjoint2(in_RDI,(size_t)in_RSI,in_R8,in_R9), bVar1 != 0)) {
    brngHMAC_keep();
    pvVar2 = blobCreate(in_stack_ffffffffffffffb8);
    if (pvVar2 == (blob_t)0x0) {
      return 0x6e;
    }
    brngHMACStart(unaff_retaddr,
                  (octet *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                  (size_t)in_RDI,in_RSI,(size_t)in_RDX);
    brngHMACStepR(unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                 );
    blobClose((blob_t)0x16d636);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t brngHMACRand(void* buf, size_t count, const octet key[], size_t key_len,
	const octet iv[], size_t iv_len)
{
	void* state;
	// проверить входные данные
	if (!memIsValid(key, key_len) ||
		!memIsValid(iv, iv_len) ||
		!memIsValid(buf, count) ||
		!memIsDisjoint2(buf, count, iv, iv_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(brngHMAC_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать данные
	brngHMACStart(state, key, key_len, iv, iv_len);
	brngHMACStepR(buf, count, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}